

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O0

void __thiscall flow::IRProgram::dump(IRProgram *this)

{
  bool bVar1;
  reference this_00;
  pointer this_01;
  unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *handler;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
  *__range1;
  IRProgram *this_local;
  
  printf("; IRProgram\n");
  __end1 = std::
           vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
           ::begin(&this->handlers_);
  handler = (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)
            std::
            vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
            ::end(&this->handlers_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_*,_std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
                                *)&handler);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_*,_std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
              ::operator*(&__end1);
    this_01 = std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>::operator->
                        (this_00);
    IRHandler::dump(this_01);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_*,_std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void IRProgram::dump() {
  printf("; IRProgram\n");

  for (auto& handler : handlers_)
    handler->dump();
}